

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void resetAccumulator(Parse *pParse,AggInfo *pAggInfo)

{
  Vdbe *p;
  long lVar1;
  KeyInfo *zP4;
  KeyInfo *pKeyInfo;
  Expr *pE;
  AggInfo_func *pFunc;
  int i;
  Vdbe *v;
  AggInfo *pAggInfo_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  if (pAggInfo->nFunc + pAggInfo->nColumn != 0) {
    for (pFunc._4_4_ = 0; pFunc._4_4_ < pAggInfo->nColumn; pFunc._4_4_ = pFunc._4_4_ + 1) {
      sqlite3VdbeAddOp2(p,10,0,pAggInfo->aCol[pFunc._4_4_].iMem);
    }
    pE = (Expr *)pAggInfo->aFunc;
    for (pFunc._4_4_ = 0; pFunc._4_4_ < pAggInfo->nFunc; pFunc._4_4_ = pFunc._4_4_ + 1) {
      sqlite3VdbeAddOp2(p,10,0,*(int *)&pE->pLeft);
      if (-1 < *(int *)((long)&pE->pLeft + 4)) {
        lVar1 = *(long *)pE;
        if ((*(long *)(lVar1 + 0x20) == 0) || (**(int **)(lVar1 + 0x20) != 1)) {
          sqlite3ErrorMsg(pParse,"DISTINCT aggregates must have exactly one argument");
          *(undefined4 *)((long)&pE->pLeft + 4) = 0xffffffff;
        }
        else {
          zP4 = keyInfoFromExprList(pParse,*(ExprList **)(lVar1 + 0x20));
          sqlite3VdbeAddOp4(p,0x2a,*(int *)((long)&pE->pLeft + 4),0,0,(char *)zP4,-0x10);
        }
      }
      pE = (Expr *)&pE->pRight;
    }
  }
  return;
}

Assistant:

static void resetAccumulator(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct AggInfo_func *pFunc;
  if( pAggInfo->nFunc+pAggInfo->nColumn==0 ){
    return;
  }
  for(i=0; i<pAggInfo->nColumn; i++){
    sqlite3VdbeAddOp2(v, OP_Null, 0, pAggInfo->aCol[i].iMem);
  }
  for(pFunc=pAggInfo->aFunc, i=0; i<pAggInfo->nFunc; i++, pFunc++){
    sqlite3VdbeAddOp2(v, OP_Null, 0, pFunc->iMem);
    if( pFunc->iDistinct>=0 ){
      Expr *pE = pFunc->pExpr;
      assert( !ExprHasProperty(pE, EP_xIsSelect) );
      if( pE->x.pList==0 || pE->x.pList->nExpr!=1 ){
        sqlite3ErrorMsg(pParse, "DISTINCT aggregates must have exactly one "
           "argument");
        pFunc->iDistinct = -1;
      }else{
        KeyInfo *pKeyInfo = keyInfoFromExprList(pParse, pE->x.pList);
        sqlite3VdbeAddOp4(v, OP_OpenEphemeral, pFunc->iDistinct, 0, 0,
                          (char*)pKeyInfo, P4_KEYINFO_HANDOFF);
      }
    }
  }
}